

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupportTest.cpp
# Opt level: O2

void __thiscall
TEST_MockSupportTestWithFixture_ShouldNotCrashOnFailureAfterCrashMethodWasReset_Test::
~TEST_MockSupportTestWithFixture_ShouldNotCrashOnFailureAfterCrashMethodWasReset_Test
          (TEST_MockSupportTestWithFixture_ShouldNotCrashOnFailureAfterCrashMethodWasReset_Test
           *this)

{
  TEST_GROUP_CppUTestGroupMockSupportTestWithFixture::
  ~TEST_GROUP_CppUTestGroupMockSupportTestWithFixture
            (&this->super_TEST_GROUP_CppUTestGroupMockSupportTestWithFixture);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockSupportTestWithFixture, ShouldNotCrashOnFailureAfterCrashMethodWasReset)
{
    cpputestHasCrashed = false;
    UtestShell::setCrashMethod(crashMethod);
    fixture.setTestFunction(unexpectedCallTestFunction_);
    UtestShell::resetCrashMethod();

    fixture.runAllTests();

    fixture.assertPrintContains("Unexpected call to function: unexpected");
    CHECK_FALSE(cpputestHasCrashed);
}